

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * prf_array_init(int initsize,int elemsize)

{
  array *ptr;
  void *pvVar1;
  uint in_ESI;
  uint in_EDI;
  array *arr;
  
  ptr = (array *)malloc((long)(int)in_EDI * (long)(int)in_ESI + 8);
  ptr->size = in_EDI;
  *(uint *)&ptr->field_0x4 = *(uint *)&ptr->field_0x4 & 0xfffffff0 | in_ESI & 0xf;
  *(uint *)&ptr->field_0x4 = *(uint *)&ptr->field_0x4 & 0xf;
  pvVar1 = prf_array_to_id(ptr);
  return pvVar1;
}

Assistant:

void *
prf_array_init(int initsize, int elemsize)
{
  array *arr;

  arr = (array *)profit_malloc((size_t)initsize*elemsize+sizeof(array));
  assert( arr != NULL );
  
  arr->size = initsize;
  arr->elemsize = elemsize;
  arr->numelem = 0;
  
  return prf_array_to_id(arr);
}